

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_vmstat(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  MOB_INDEX_DATA *pMVar2;
  CHAR_DATA *pCVar3;
  char buf [4608];
  CHAR_DATA *victim;
  MOB_INDEX_DATA *pMobIndex;
  char arg [4608];
  char *in_stack_00005110;
  CHAR_DATA *in_stack_00005118;
  char *in_stack_ffffffffffffdbd8;
  char *in_stack_ffffffffffffdbe0;
  undefined4 in_stack_ffffffffffffdbe8;
  int in_stack_ffffffffffffdbec;
  char *in_stack_ffffffffffffdbf0;
  ROOM_INDEX_DATA *in_stack_ffffffffffffdc08;
  CHAR_DATA *in_stack_ffffffffffffdc10;
  MOB_INDEX_DATA *in_stack_ffffffffffffdcb0;
  undefined1 in_stack_ffffffffffffdcbf;
  CHAR_DATA *in_stack_ffffffffffffdcc0;
  char local_1218 [4632];
  
  one_argument(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  if ((local_1218[0] != '\0') && (bVar1 = is_number(in_stack_ffffffffffffdbd8), bVar1)) {
    atoi(local_1218);
    pMVar2 = get_mob_index(in_stack_ffffffffffffdbec);
    if (pMVar2 == (MOB_INDEX_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffdbf0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbec,in_stack_ffffffffffffdbe8));
      return;
    }
    pCVar3 = create_mobile(in_stack_ffffffffffffdcb0);
    char_to_room(in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc08);
    sprintf(&stack0xffffffffffffdbd8,"%s",pCVar3->name);
    do_mstat(in_stack_00005118,in_stack_00005110);
    extract_char(in_stack_ffffffffffffdcc0,(bool)in_stack_ffffffffffffdcbf);
    return;
  }
  send_to_char(in_stack_ffffffffffffdbf0,
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbec,in_stack_ffffffffffffdbe8));
  return;
}

Assistant:

void do_vmstat(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	MOB_INDEX_DATA *pMobIndex;
	CHAR_DATA *victim;
	char buf[MAX_STRING_LENGTH];

	one_argument(argument, arg);

	if (arg[0] == '\0' || !is_number(arg))
	{
		send_to_char("Syntax: vstat mob [vnum]\n\r", ch);
		return;
	}

	pMobIndex = get_mob_index(atoi(arg));

	if (pMobIndex == nullptr)
	{
		send_to_char("No mob has that vnum.\n\r", ch);
		return;
	}

	victim = create_mobile(pMobIndex);

	char_to_room(victim, ch->in_room);

	sprintf(buf, "%s", victim->name);
	do_mstat(ch, buf);

	extract_char(victim, true);
}